

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

char * despot::util::tinyxml::TiXmlBase::SkipWhiteSpace(char *p,TiXmlEncoding encoding)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  byte bVar4;
  
  if ((p == (char *)0x0) || (bVar4 = *p, bVar4 == 0)) {
    p = (char *)0x0;
  }
  else {
    if (encoding == TIXML_ENCODING_UTF8) {
      do {
        uVar3 = (uint)bVar4;
        if (bVar4 == 0xef) {
          if (p[1] != -0x41) {
            if (p[1] == -0x45) goto LAB_00171a8d;
            goto LAB_00171a93;
          }
          lVar2 = 3;
          if (p[2] != -0x42) {
LAB_00171a8d:
            lVar2 = 3;
            if (p[2] != -0x41) goto LAB_00171a93;
          }
        }
        else {
          if (uVar3 == 0) {
            return p;
          }
LAB_00171a93:
          iVar1 = isspace(uVar3);
          lVar2 = 1;
          if (((iVar1 == 0) && (bVar4 != 10)) && (uVar3 != 0xd)) {
            return p;
          }
        }
        bVar4 = p[lVar2];
        p = p + lVar2;
      } while( true );
    }
    do {
      iVar1 = isspace((uint)bVar4);
      if (((iVar1 == 0) && (bVar4 != 0xd)) && (bVar4 != 10)) {
        return p;
      }
      bVar4 = p[1];
      p = p + 1;
    } while (bVar4 != 0);
  }
  return p;
}

Assistant:

const char* TiXmlBase::SkipWhiteSpace(const char* p, TiXmlEncoding encoding) {
	if (!p || !*p) {
		return 0;
	}
	if (encoding == TIXML_ENCODING_UTF8) {
		while (*p) {
			const unsigned char* pU = (const unsigned char*) p;

			// Skip the stupid Microsoft UTF-8 Byte order marks
			if (*(pU + 0) == TIXML_UTF_LEAD_0 && *(pU + 1) == TIXML_UTF_LEAD_1
				&& *(pU + 2) == TIXML_UTF_LEAD_2) {
				p += 3;
				continue;
			} else if (*(pU + 0) == TIXML_UTF_LEAD_0 && *(pU + 1) == 0xbfU
				&& *(pU + 2) == 0xbeU) {
				p += 3;
				continue;
			} else if (*(pU + 0) == TIXML_UTF_LEAD_0 && *(pU + 1) == 0xbfU
				&& *(pU + 2) == 0xbfU) {
				p += 3;
				continue;
			}

			if (IsWhiteSpace(*p) || *p == '\n' || *p == '\r') // Still using old rules for white space.
				++p;
			else
				break;
		}
	} else {
		while (*p && (IsWhiteSpace(*p) || *p == '\n' || *p == '\r'))
			++p;
	}

	return p;
}